

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::Filter::sampleTriangle(Filter *this,float x,float scale,int samples)

{
  float extraout_XMM0_Da;
  float local_38;
  float weight;
  float value;
  float p;
  float offset;
  int s;
  float isamples;
  float sum;
  int samples_local;
  float scale_local;
  float x_local;
  Filter *this_local;
  
  s = 0;
  for (p = 0.0; (int)p < samples; p = (float)((int)p + 1)) {
    local_38 = ((float)(int)p + (float)(int)p + 1.0) * (1.0 / (float)samples);
    (*this->_vptr_Filter[2])(((x + local_38) - 0.5) * scale);
    if (1.0 < local_38) {
      local_38 = 2.0 - local_38;
    }
    s = (int)(extraout_XMM0_Da * local_38 + (float)s);
  }
  return (float)s * 2.0 * (1.0 / (float)samples);
}

Assistant:

float Filter::sampleTriangle(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float offset = (2 * float(s) + 1.0f) * isamples;		
		float p = (x + offset - 0.5f) * scale;
		float value = evaluate(p);
		
		float weight = offset;
		if (weight > 1.0f) weight = 2.0f - weight;
		
		sum += value * weight;
	}
	
	return 2 * sum * isamples;
}